

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_4::PtexUtils::reduceu
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  byte *pbVar1;
  ushort *puVar2;
  ushort *puVar3;
  float *pfVar4;
  float *pfVar5;
  uint16_t uVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  switch(dt) {
  case dt_uint8:
    if (vw * sstride != 0) {
      pbVar7 = (byte *)((long)(vw * sstride) + (long)src);
      iVar8 = uw * nchan;
      lVar12 = (long)nchan;
      do {
        if (iVar8 != 0) {
          pbVar1 = (byte *)((long)src + (long)iVar8);
          do {
            if (nchan != 0) {
              lVar11 = 0;
              do {
                *(char *)((long)dst + lVar11) =
                     (char)((uint)*(byte *)((long)src + lVar12) + (uint)*src >> 1);
                src = (void *)((long)src + 1);
                lVar11 = lVar11 + 1;
              } while (lVar12 != lVar11);
              dst = (void *)((long)dst + lVar11);
            }
            src = (void *)((long)src + lVar12);
          } while ((byte *)src != pbVar1);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar8 / 2));
        src = (void *)((long)src + (long)(sstride - iVar8));
      } while ((byte *)src != pbVar7);
    }
    break;
  case dt_uint16:
    iVar8 = vw * (sstride / 2);
    if (iVar8 != 0) {
      puVar2 = (ushort *)((long)src + (long)iVar8 * 2);
      iVar8 = uw * nchan;
      lVar12 = (long)nchan;
      do {
        if (iVar8 != 0) {
          puVar3 = (ushort *)((long)src + (long)iVar8 * 2);
          do {
            if (nchan != 0) {
              lVar11 = 0;
              do {
                *(short *)((long)dst + lVar11) =
                     (short)((uint)*(ushort *)((long)src + lVar12 * 2) + (uint)*src >> 1);
                src = (void *)((long)src + 2);
                lVar11 = lVar11 + 2;
              } while (lVar12 * 2 != lVar11);
              dst = (void *)((long)dst + lVar11);
            }
            src = (void *)((long)src + lVar12 * 2);
          } while ((ushort *)src != puVar3);
        }
        src = (void *)((long)src + (long)(sstride / 2 - iVar8) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar8 / 2) * 2);
      } while ((ushort *)src != puVar2);
    }
    break;
  case dt_half:
    iVar8 = vw * (sstride / 2);
    if (iVar8 != 0) {
      puVar2 = (ushort *)((long)src + (long)iVar8 * 2);
      iVar8 = uw * nchan;
      lVar12 = (long)nchan;
      do {
        if (iVar8 != 0) {
          puVar3 = (ushort *)((long)src + (long)iVar8 * 2);
          do {
            if (nchan != 0) {
              lVar11 = 0;
              do {
                uVar6 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable + (ulong)*src * 4) +
                                            *(float *)(PtexHalf::h2fTable +
                                                      (ulong)*(ushort *)((long)src + lVar12 * 2) * 4
                                                      )) * 0.5);
                *(uint16_t *)((long)dst + lVar11) = uVar6;
                src = (void *)((long)src + 2);
                lVar11 = lVar11 + 2;
              } while (lVar12 * 2 != lVar11);
              dst = (void *)((long)dst + lVar11);
            }
            src = (void *)((long)src + lVar12 * 2);
          } while ((ushort *)src != puVar3);
        }
        src = (void *)((long)src + (long)(sstride / 2 - iVar8) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar8 / 2) * 2);
      } while ((ushort *)src != puVar2);
    }
    break;
  case dt_float:
    iVar8 = sstride + 3;
    if (-1 < sstride) {
      iVar8 = sstride;
    }
    iVar9 = vw * (iVar8 >> 2);
    if (iVar9 != 0) {
      pfVar4 = (float *)((long)src + (long)iVar9 * 4);
      iVar10 = uw * nchan;
      iVar9 = dstride + 3;
      if (-1 < dstride) {
        iVar9 = dstride;
      }
      lVar12 = (long)nchan;
      do {
        if (iVar10 != 0) {
          pfVar5 = (float *)((long)src + (long)iVar10 * 4);
          do {
            if (nchan != 0) {
              lVar11 = 0;
              do {
                *(float *)((long)dst + lVar11) = (*src + *(float *)((long)src + lVar12 * 4)) * 0.5;
                src = (void *)((long)src + 4);
                lVar11 = lVar11 + 4;
              } while (lVar12 * 4 - lVar11 != 0);
              dst = (void *)((long)dst + lVar11);
            }
            src = (void *)((long)src + lVar12 * 4);
          } while ((float *)src != pfVar5);
        }
        src = (void *)((long)src + (long)((iVar8 >> 2) - iVar10) * 4);
        dst = (void *)((long)dst + (long)((iVar9 >> 2) - iVar10 / 2) * 4);
      } while ((float *)src != pfVar4);
    }
  }
  return;
}

Assistant:

void reduceu(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceu(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceu(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceu(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceu(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}